

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClass *pSVar3;
  SQTable *pSVar4;
  SQObjectValue *pSVar5;
  SQUnsignedInteger SVar6;
  
  pSVar3 = this->_class;
  SVar6 = (pSVar3->_defaultvalues)._size;
  if (pSVar3 != (SQClass *)0x0) {
    pSVar1 = &(pSVar3->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_class = (SQClass *)0x0;
  }
  if (0 < (long)SVar6) {
    pSVar5 = &this->_values[0].super_SQObject._unVal;
    do {
      pSVar4 = pSVar5->pTable;
      SVar2 = ((SQObject *)(pSVar5 + -1))->_type;
      ((SQObject *)(pSVar5 + -1))->_type = OT_NULL;
      pSVar5->pTable = (SQTable *)0x0;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      pSVar5 = pSVar5 + 2;
      SVar6 = SVar6 - 1;
    } while (SVar6 != 0);
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}